

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

bool __thiscall
FIX::double_conversion::DoubleToStringConverter::HandleSpecialValues
          (DoubleToStringConverter *this,double value,StringBuilder *result_builder)

{
  bool bVar1;
  Double local_30;
  Double double_inspect;
  StringBuilder *result_builder_local;
  double value_local;
  DoubleToStringConverter *this_local;
  
  double_inspect.d64_ = (uint64_t)result_builder;
  Double::Double(&local_30,value);
  bVar1 = Double::IsInfinite(&local_30);
  if (bVar1) {
    if (this->infinity_symbol_ == (char *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      if (value < 0.0) {
        StringBuilder::AddCharacter((StringBuilder *)double_inspect.d64_,'-');
      }
      StringBuilder::AddString((StringBuilder *)double_inspect.d64_,this->infinity_symbol_);
      this_local._7_1_ = true;
    }
  }
  else {
    bVar1 = Double::IsNan(&local_30);
    if (bVar1) {
      if (this->nan_symbol_ == (char *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        StringBuilder::AddString((StringBuilder *)double_inspect.d64_,this->nan_symbol_);
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DoubleToStringConverter::HandleSpecialValues(
    double value,
    StringBuilder* result_builder) const {
  Double double_inspect(value);
  if (double_inspect.IsInfinite()) {
    if (infinity_symbol_ == NULL) return false;
    if (value < 0) {
      result_builder->AddCharacter('-');
    }
    result_builder->AddString(infinity_symbol_);
    return true;
  }
  if (double_inspect.IsNan()) {
    if (nan_symbol_ == NULL) return false;
    result_builder->AddString(nan_symbol_);
    return true;
  }
  return false;
}